

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

bool helics::changeDetected
               (defV *prevValue,vector<double,_std::allocator<double>_> *val,double deltaV)

{
  char *pcVar1;
  vector<double,_std::allocator<double>_> *this;
  size_type sVar2;
  size_type sVar3;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar4;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  size_t ii;
  vector<double,_std::allocator<double>_> *prevV;
  ulong local_30;
  
  pcVar1 = std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,(char *)in_RSI,in_EDX);
  if (pcVar1 == (char *)0x4) {
    this = std::
           get<std::vector<double,std::allocator<double>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x2b1972);
    sVar2 = CLI::std::vector<double,_std::allocator<double>_>::size(in_RSI);
    sVar3 = CLI::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)this);
    if (sVar2 == sVar3) {
      local_30 = 0;
      while( true ) {
        sVar2 = CLI::std::vector<double,_std::allocator<double>_>::size(in_RSI);
        if (sVar2 <= local_30) {
          return false;
        }
        std::vector<double,_std::allocator<double>_>::operator[](this,local_30);
        pvVar4 = in_RSI;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)in_RSI,local_30);
        std::abs((int)pvVar4);
        if (in_XMM0_Qa < extraout_XMM0_Qa) break;
        local_30 = local_30 + 1;
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool changeDetected(const defV& prevValue, const std::vector<double>& val, double deltaV)
{
    if (prevValue.index() == vector_loc) {
        const auto& prevV = std::get<std::vector<double>>(prevValue);
        if (val.size() == prevV.size()) {
            for (size_t ii = 0; ii < val.size(); ++ii) {
                if (std::abs(prevV[ii] - val[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}